

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O0

Var Js::WebAssembly::TryResolveResponse(RecyclableObject *function,Var thisArg,Var responseArg)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  JavascriptFunction *fulfillmentHandler;
  JavascriptFunction *rejectionHandler;
  undefined4 *puVar3;
  JavascriptPromise *promise;
  CallInfo local_54;
  CallInfo local_4c;
  CallInfo newCallInfo;
  bool isResponse;
  Var responsePromise;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  Var responseArg_local;
  Var thisArg_local;
  RecyclableObject *function_local;
  
  this = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetLibrary(this);
  stack0xffffffffffffffc0 = (Var)0x0;
  newCallInfo._3_1_ = IsResponseObject(responseArg,this);
  if ((bool)newCallInfo._3_1_) {
    CallInfo::CallInfo(&local_4c);
    local_4c = (CallInfo)((ulong)local_4c & 0xffffffffff000000 | 2);
    CallInfo::CallInfo(&local_54,CallFlags_Value,2);
    CallInfo::CallInfo((CallInfo *)((long)&promise + 4),CallFlags_Value,2);
    register0x00000000 =
         EntryQueryResponse(function,local_54,0,0,0,0,function,stack0xffffffffffffffa4,thisArg,
                            responseArg);
  }
  else {
    bVar2 = VarIs<Js::JavascriptPromise>(responseArg);
    if (bVar2) {
      fulfillmentHandler = JavascriptLibrary::GetWebAssemblyQueryResponseFunction(this_00);
      rejectionHandler = JavascriptLibrary::GetThrowerFunction(this_00);
      register0x00000000 =
           JavascriptPromise::CreateThenPromise
                     ((JavascriptPromise *)responseArg,(RecyclableObject *)fulfillmentHandler,
                      (RecyclableObject *)rejectionHandler,this);
    }
  }
  if ((stack0xffffffffffffffc0 != (Var)0x0) &&
     (bVar2 = VarIs<Js::JavascriptPromise>(stack0xffffffffffffffc0), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x11a,"((0))",
                                "How did we end up with something other than a promise here ?");
    if (bVar2) {
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
      JavascriptError::ThrowTypeError(this,-0x7ff5e494,(PCWSTR)0x0);
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return stack0xffffffffffffffc0;
}

Assistant:

Var WebAssembly::TryResolveResponse(RecyclableObject* function, Var thisArg, Var responseArg)
{
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    Var responsePromise = nullptr;
    bool isResponse = IsResponseObject(responseArg, scriptContext);
    if (isResponse)
    {
        CallInfo newCallInfo;
        newCallInfo.Count = 2;
        // We already have a response object, query it now
        responsePromise = CALL_ENTRYPOINT_NOASSERT(EntryQueryResponse, function, Js::CallInfo(CallFlags_Value, 2), thisArg, responseArg);
    }
    else if (VarIs<JavascriptPromise>(responseArg))
    {
        JavascriptPromise* promise = (JavascriptPromise*)responseArg;
        // Wait until this promise resolves and then try to query the response object (if it's a response object)
        responsePromise = JavascriptPromise::CreateThenPromise(promise, library->GetWebAssemblyQueryResponseFunction(), library->GetThrowerFunction(), scriptContext);
    }
    if (responsePromise && !VarIs<JavascriptPromise>(responsePromise))
    {
        AssertMsg(UNREACHED, "How did we end up with something other than a promise here ?");
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedResponse);
    }
    return responsePromise;
}